

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O0

BigSudokuVisualizer * __thiscall
BigSudokuVisualizer::createBorderRightStyle_abi_cxx11_
          (BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  uint uVar1;
  SudokuGitter *in_RDX;
  string local_80 [32];
  __cxx11 local_60 [32];
  uint local_40;
  uint i;
  allocator local_2a;
  undefined1 local_29;
  uint local_28;
  uint local_24;
  uint elements;
  uint size;
  SudokuGitter *gitter_local;
  BigSudokuVisualizer *this_local;
  string *border_right;
  
  gitter_local = gitter;
  this_local = this;
  local_24 = SudokuGitter::getElements(in_RDX);
  local_28 = local_24 * local_24;
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  local_40 = SudokuGitter::getQuadWidth(in_RDX);
  for (local_40 = local_40 - 1; local_40 < local_28; local_40 = uVar1 + local_40) {
    std::__cxx11::string::append((char *)this);
    std::__cxx11::to_string(local_60,local_40);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::append((char *)this);
    uVar1 = SudokuGitter::getQuadWidth(in_RDX);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_80,(ulong)this);
  std::__cxx11::string::operator=((string *)this,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::append((char *)this);
  return this;
}

Assistant:

const std::string BigSudokuVisualizer::createBorderRightStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int elements = size * size;
    std::string border_right = "";
    for (unsigned int i = gitter.getQuadWidth() - 1; i < elements; i += gitter.getQuadWidth()) {
        border_right.append("#bigCell-");
        border_right.append(std::to_string(i));
        border_right.append(", ");
    }
    border_right = border_right.substr(0, border_right.length() - 2);
    border_right.append(" { border-right: 2px solid #000; } ");
    return border_right;
}